

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::RemoveDeferParseAttribute(FunctionBody *this)

{
  Attributes AVar1;
  
  AVar1 = FunctionProxy::GetAttributes((FunctionProxy *)this);
  FunctionProxy::SetAttributes((FunctionProxy *)this,AVar1 & ~DeferredParse);
  return;
}

Assistant:

void FunctionBody::RemoveDeferParseAttribute()
    {
        this->SetAttributes((FunctionInfo::Attributes) (this->GetAttributes() & (~FunctionInfo::Attributes::DeferredParse)));
    }